

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O0

void Am_Move_Object(Am_Object *object,Am_Object *ref_object,bool above)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Value *pAVar3;
  Am_Ptr pvVar4;
  Am_Drawonable *pAVar5;
  Am_Drawonable *pAVar6;
  ostream *poVar7;
  Am_Drawonable *draw2;
  Am_Drawonable *draw1;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Slot local_80;
  Am_Object local_78;
  Am_Object current;
  undefined1 local_68 [4];
  int rank;
  Am_Value_List components;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  undefined4 local_38;
  Am_Object local_28;
  Am_Object owner;
  bool above_local;
  Am_Object *ref_object_local;
  Am_Object *object_local;
  
  owner.data._7_1_ = above;
  bVar1 = Am_Object::Valid(object);
  if ((!bVar1) || (bVar1 = Am_Object::Valid(ref_object), !bVar1)) {
    Am_Error("** Am_Move_Object called with (0L) object or ref_object\n");
  }
  bVar1 = Am_Object::operator==(object,ref_object);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object called same object, ");
    poVar7 = operator<<(poVar7,object);
    poVar7 = std::operator<<(poVar7,", as both moved object and reference object.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)object);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)ref_object);
    bVar1 = Am_Object::operator!=(&local_40,&local_28);
    Am_Object::~Am_Object(&local_40);
    if (bVar1) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object:  the object ");
      poVar7 = operator<<(poVar7,object);
      poVar7 = std::operator<<(poVar7," has owner ");
      poVar7 = operator<<(poVar7,&local_28);
      poVar7 = std::operator<<(poVar7,"and the ref_object ");
      poVar7 = operator<<(poVar7,ref_object);
      poVar7 = std::operator<<(poVar7," has owner ");
      Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)ref_object);
      poVar7 = operator<<(poVar7,&local_48);
      poVar7 = std::operator<<(poVar7," they must be the same.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      Am_Object::~Am_Object(&local_48);
      Am_Error();
    }
    Am_Object::Am_Object(&local_50,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(object,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      Am_Object::Am_Object((Am_Object *)&components.item,&Am_Graphical_Object);
      bVar1 = Am_Object::Is_Instance_Of(ref_object,(Am_Object *)&components.item);
      Am_Object::~Am_Object((Am_Object *)&components.item);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object called with an object ");
        poVar7 = operator<<(poVar7,object);
        poVar7 = std::operator<<(poVar7," that is a graphical object and a ref_object ");
        poVar7 = operator<<(poVar7,ref_object);
        poVar7 = std::operator<<(poVar7," that is not.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Object::Make_Unique(&local_28,0x82);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_68);
      pAVar3 = Am_Object::Get(&local_28,0x82,0);
      Am_Value_List::operator=((Am_Value_List *)local_68,pAVar3);
      Am_Value_List::Start((Am_Value_List *)local_68);
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(object);
      Am_Value_List::Member((Am_Value_List *)local_68,pAVar2);
      Am_Value_List::Delete((Am_Value_List *)local_68,false);
      Am_Value_List::Start((Am_Value_List *)local_68);
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(ref_object);
      Am_Value_List::Member((Am_Value_List *)local_68,pAVar2);
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(object);
      Am_Value_List::Insert((Am_Value_List *)local_68,pAVar2,owner.data._7_1_ & Am_AFTER,false);
      current.data._4_4_ = 0;
      Am_Object::Am_Object(&local_78);
      Am_Value_List::Start((Am_Value_List *)local_68);
      while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
        pAVar3 = Am_Value_List::Get((Am_Value_List *)local_68);
        Am_Object::operator=(&local_78,pAVar3);
        Am_Object::Set(&local_78,0x85,current.data._4_4_,0);
        current.data._4_4_ = current.data._4_4_ + 1;
        Am_Value_List::Next((Am_Value_List *)local_68);
      }
      Am_Object::Note_Changed(&local_28,0x82);
      local_80 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)object,0x69);
      Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_repaint,0,&local_80);
      Am_Object::~Am_Object(&local_78);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
    }
    else {
      Am_Object::Am_Object(&local_88,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(object,&local_88);
      Am_Object::~Am_Object(&local_88);
      if (!bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object: Attempt to move ");
        poVar7 = operator<<(poVar7,object);
        poVar7 = std::operator<<(poVar7," which is not a graphical object or window");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Object::Am_Object(&local_90,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(ref_object,&local_90);
      Am_Object::~Am_Object(&local_90);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object called with an object ");
        poVar7 = operator<<(poVar7,object);
        poVar7 = std::operator<<(poVar7," that is a window and a ref_object ");
        poVar7 = operator<<(poVar7,ref_object);
        poVar7 = std::operator<<(poVar7," that is not.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Object::Get_Owner(&local_98,(Am_Slot_Flags)object);
      Am_Object::Get_Owner((Am_Object *)&draw1,(Am_Slot_Flags)ref_object);
      bVar1 = Am_Object::operator!=(&local_98,(Am_Object *)&draw1);
      Am_Object::~Am_Object((Am_Object *)&draw1);
      Am_Object::~Am_Object(&local_98);
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object called with two windows");
        poVar7 = std::operator<<(poVar7," with different parents: ");
        poVar7 = operator<<(poVar7,object);
        poVar7 = std::operator<<(poVar7,", ");
        operator<<(poVar7,ref_object);
      }
      pAVar3 = Am_Object::Get(object,0x7d2,0);
      pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
      pAVar5 = Am_Drawonable::Narrow(pvVar4);
      pAVar3 = Am_Object::Get(ref_object,0x7d2,0);
      pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
      pAVar6 = Am_Drawonable::Narrow(pvVar4);
      if ((pAVar5 != (Am_Drawonable *)0x0) && (pAVar6 != (Am_Drawonable *)0x0)) {
        if ((owner.data._7_1_ & 1) == 0) {
          (*pAVar5->_vptr_Am_Drawonable[6])(pAVar5,pAVar6);
        }
        else {
          (*pAVar5->_vptr_Am_Drawonable[5])(pAVar5,pAVar6);
        }
      }
    }
    local_38 = 0;
  }
  else {
    local_38 = 1;
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
Am_Move_Object(Am_Object object, Am_Object ref_object, bool above)
{
  if (!object.Valid() || !ref_object.Valid())
    Am_Error("** Am_Move_Object called with (0L) object or ref_object\n");
  if (object == ref_object) {
    std::cerr << "** Am_Move_Object called same object, " << object
              << ", as both "
                 "moved object and reference object."
              << std::endl;
    Am_Error();
  }
  Am_Object owner = object.Get_Owner();
  if (!owner.Valid())
    return;
  if (ref_object.Get_Owner() != owner) {
    std::cerr << "** Am_Move_Object:  the object " << object << " has owner "
              << owner << "and the ref_object " << ref_object << " has owner "
              << ref_object.Get_Owner() << " they must be the same."
              << std::endl;
    Am_Error();
  }
  if (object.Is_Instance_Of(Am_Graphical_Object)) {
    if (!ref_object.Is_Instance_Of(Am_Graphical_Object)) {
      std::cerr << "** Am_Move_Object called with an object " << object
                << " that is a graphical object and a ref_object " << ref_object
                << " that is not." << std::endl;
      Am_Error();
    }
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    Am_Value_List components;
    components = owner.Get(Am_GRAPHICAL_PARTS);
    components.Start();
    components.Member(object);
    components.Delete(false);
    components.Start();
    components.Member(ref_object);
    components.Insert(object, above ? Am_AFTER : Am_BEFORE, false);
    int rank = 0;
    Am_Object current;
    for (components.Start(); !components.Last(); components.Next()) {
      current = components.Get();
      current.Set(Am_RANK, rank);
      ++rank;
    }
    owner.Note_Changed(Am_GRAPHICAL_PARTS);
    Main_Demon_Queue.Enqueue(
        graphics_repaint, 0,
        ((Am_Object_Advanced &)object).Get_Slot(Am_VISIBLE));
  } else if (object.Is_Instance_Of(Am_Window)) {
    if (!ref_object.Is_Instance_Of(Am_Window)) {
      std::cerr << "** Am_Move_Object called with an object " << object
                << " that is a window and a ref_object " << ref_object
                << " that is not." << std::endl;
      Am_Error();
    };
    // objects must have same parent
    if (object.Get_Owner() != ref_object.Get_Owner()) {
      std::cerr << "** Am_Move_Object called with two windows"
                << " with different parents: " << object << ", " << ref_object;
    }
    Am_Drawonable *draw1 = Am_Drawonable::Narrow(object.Get(Am_DRAWONABLE));
    Am_Drawonable *draw2 = Am_Drawonable::Narrow(ref_object.Get(Am_DRAWONABLE));
    if (draw1 && draw2) {
      if (above) {
        draw1->Raise_Window(draw2);
      } else {
        draw1->Lower_Window(draw2);
      }
    }
  } else {
    std::cerr << "** Am_Move_Object: Attempt to move " << object
              << " which is not a graphical object or window" << std::endl;
    Am_Error();
  }
}